

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::internal::
SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::~SchemaValidationContext
          (SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this)

{
  uint local_18;
  uint local_14;
  SizeType i_1;
  SizeType i;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if (this->hasher != (void *)0x0) {
    (*this->factory->_vptr_ISchemaStateFactory[6])(this->factory,this->hasher);
  }
  if (this->validators != (ISchemaValidator **)0x0) {
    for (local_14 = 0; local_14 < this->validatorCount; local_14 = local_14 + 1) {
      if (this->validators[local_14] != (ISchemaValidator *)0x0) {
        (*this->factory->_vptr_ISchemaStateFactory[3])(this->factory,this->validators[local_14]);
      }
    }
    (*this->factory->_vptr_ISchemaStateFactory[8])(this->factory,this->validators);
  }
  if (this->patternPropertiesValidators != (ISchemaValidator **)0x0) {
    for (local_18 = 0; local_18 < this->patternPropertiesValidatorCount; local_18 = local_18 + 1) {
      if (this->patternPropertiesValidators[local_18] != (ISchemaValidator *)0x0) {
        (*this->factory->_vptr_ISchemaStateFactory[3])
                  (this->factory,this->patternPropertiesValidators[local_18]);
      }
    }
    (*this->factory->_vptr_ISchemaStateFactory[8])(this->factory,this->patternPropertiesValidators);
  }
  if (this->patternPropertiesSchemas != (SchemaType **)0x0) {
    (*this->factory->_vptr_ISchemaStateFactory[8])(this->factory,this->patternPropertiesSchemas);
  }
  if (this->propertyExist != (bool *)0x0) {
    (*this->factory->_vptr_ISchemaStateFactory[8])(this->factory,this->propertyExist);
  }
  return;
}

Assistant:

~SchemaValidationContext() {
        if (hasher)
            factory.DestroryHasher(hasher);
        if (validators) {
            for (SizeType i = 0; i < validatorCount; i++) {
                if (validators[i]) {
                    factory.DestroySchemaValidator(validators[i]);
                }
            }
            factory.FreeState(validators);
        }
        if (patternPropertiesValidators) {
            for (SizeType i = 0; i < patternPropertiesValidatorCount; i++) {
                if (patternPropertiesValidators[i]) {
                    factory.DestroySchemaValidator(patternPropertiesValidators[i]);
                }
            }
            factory.FreeState(patternPropertiesValidators);
        }
        if (patternPropertiesSchemas)
            factory.FreeState(patternPropertiesSchemas);
        if (propertyExist)
            factory.FreeState(propertyExist);
    }